

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

lys_when * lys_when_dup(lys_module *mod,lys_when *old,int shallow,unres_schema *unres)

{
  uint8_t size;
  lys_when *parent;
  char *pcVar1;
  
  parent = (lys_when *)calloc(1,0x28);
  if (parent == (lys_when *)0x0) {
    ly_log(mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_when_dup");
  }
  else {
    pcVar1 = lydict_insert(mod->ctx,old->cond,0);
    parent->cond = pcVar1;
    pcVar1 = lydict_insert(mod->ctx,old->dsc,0);
    parent->dsc = pcVar1;
    pcVar1 = lydict_insert(mod->ctx,old->ref,0);
    parent->ref = pcVar1;
    size = old->ext_size;
    parent->ext_size = size;
    lys_ext_dup(mod->ctx,mod,old->ext,size,parent,LYEXT_PAR_WHEN,&parent->ext,shallow,unres);
  }
  return parent;
}

Assistant:

static struct lys_when *
lys_when_dup(struct lys_module *mod, struct lys_when *old, int shallow, struct unres_schema *unres)
{
    struct lys_when *new;

    if (!old) {
        return NULL;
    }

    new = calloc(1, sizeof *new);
    LY_CHECK_ERR_RETURN(!new, LOGMEM(mod->ctx), NULL);
    new->cond = lydict_insert(mod->ctx, old->cond, 0);
    new->dsc = lydict_insert(mod->ctx, old->dsc, 0);
    new->ref = lydict_insert(mod->ctx, old->ref, 0);
    new->ext_size = old->ext_size;
    lys_ext_dup(mod->ctx, mod, old->ext, old->ext_size, new, LYEXT_PAR_WHEN, &new->ext, shallow, unres);

    return new;
}